

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void duckdb::MinOperation::Combine<duckdb::MinMaxState<unsigned_short>,duckdb::MinOperation>
               (MinMaxState<unsigned_short> *source,MinMaxState<unsigned_short> *target,
               AggregateInputData *param_3)

{
  if (source->isset == true) {
    if (target->isset == false) {
      *target = *source;
      return;
    }
    if (source->value < target->value) {
      target->value = source->value;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.isset) {
			// source is NULL, nothing to do
			return;
		}
		if (!target.isset) {
			// target is NULL, use source value directly
			target = source;
		} else if (GreaterThan::Operation(target.value, source.value)) {
			target.value = source.value;
		}
	}